

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O1

char * LPStatusString(LPStatus status)

{
  if (status < 4) {
    return &DAT_00104384 + *(int *)(&DAT_00104384 + (ulong)status * 4);
  }
  return "";
}

Assistant:

const char *
LPStatusString(const LPStatus status)
{
	switch (status) {
		case LUNAPURPURA_OK: return "OK"; break;
		case LUNAPURPURA_ERROR: return "Error"; break;
		case LUNAPURPURA_CANTOPENFILE: return "Can't open file"; break;
		case LUNAPURPURA_BADMAGIC: return "Bad magic"; break;
		default: return "";
	}
}